

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O2

void __thiscall EditorInterface::showSaveDialog(EditorInterface *this,function<void_()> *action)

{
  element_type *peVar1;
  element_type *peVar2;
  size_type sVar3;
  _Link_type p_Var4;
  undefined8 *puVar5;
  Vector2f *pVVar6;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *pmVar7;
  float x;
  float y;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar8;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  element_type *local_a8;
  undefined1 local_a0 [16];
  function<void_()> local_90;
  shared_ptr<gui::DialogBox> saveDialog;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  
  ::gui::Widget::sendToFront
            (&(((this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_Group).super_Container.super_Widget);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,1);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::locale::locale((locale *)local_c8._M_pod_data);
  sf::String::String((String *)local_a0,"saveDialog",(locale *)local_c8._M_pod_data);
  ::gui::ContainerBase::getChild<gui::DialogBox>
            ((ContainerBase *)&saveDialog,(String *)peVar1,SUB81(local_a0,0));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_a0);
  std::locale::~locale((locale *)local_c8._M_pod_data);
  peVar2 = saveDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)local_c8._M_pod_data);
  sf::String::String((String *)local_a0,"saveSubmitButton",(locale *)local_c8._M_pod_data);
  ::gui::ContainerBase::getChild<gui::Button>
            ((ContainerBase *)&saveSubmitButton,(String *)peVar2,SUB81(local_a0,0));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_a0);
  std::locale::~locale((locale *)local_c8._M_pod_data);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::clear(&((saveSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           onClick).callbacks_._M_t);
  local_a8 = peVar2;
  local_a0._8_8_ = peVar2;
  local_a0._0_8_ = this;
  std::function<void_()>::function((function<void_()> *)(local_a0 + 0x10),action);
  pmVar7 = &((saveSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            onClick).callbacks_;
  while( true ) {
    sVar3 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(pmVar7,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    if (sVar3 == 0) break;
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  }
  p_Var4 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           ::_M_get_node(&pmVar7->_M_t);
  *(int *)(p_Var4->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  puVar5 = (undefined8 *)operator_new(0x30);
  *puVar5 = local_a0._0_8_;
  puVar5[1] = local_a0._8_8_;
  std::function<void_()>::function
            ((function<void_()> *)(puVar5 + 2),(function<void_()> *)(local_a0 + 0x10));
  pcStack_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:201:39)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:201:39)>
             ::_M_manager;
  local_c8._M_unused._M_object = puVar5;
  ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::Callback
            ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
             ((p_Var4->_M_storage)._M_storage + 8),(function<void_()> *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  pVar8 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos(&pmVar7->_M_t,(key_type_conflict1 *)&p_Var4->_M_storage);
  if (pVar8.second == (_Base_ptr)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_drop_node(&pmVar7->_M_t,p_Var4);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node(&pmVar7->_M_t,pVar8.first,pVar8.second,p_Var4);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  std::_Function_base::~_Function_base((_Function_base *)(local_a0 + 0x10));
  peVar2 = saveDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)local_c8._M_pod_data);
  sf::String::String((String *)local_a0,"saveRefuseButton",(locale *)local_c8._M_pod_data);
  ::gui::ContainerBase::getChild<gui::Button>
            ((ContainerBase *)&saveRefuseButton,(String *)peVar2,SUB81(local_a0,0));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_a0);
  std::locale::~locale((locale *)local_c8._M_pod_data);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::clear(&((saveRefuseButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           onClick).callbacks_._M_t);
  local_a0._8_8_ = local_a8;
  local_a0._0_8_ = this;
  std::function<void_()>::function((function<void_()> *)(local_a0 + 0x10),action);
  pmVar7 = &((saveRefuseButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            onClick).callbacks_;
  while( true ) {
    sVar3 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(pmVar7,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    if (sVar3 == 0) break;
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  }
  p_Var4 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           ::_M_get_node(&pmVar7->_M_t);
  *(int *)(p_Var4->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  puVar5 = (undefined8 *)operator_new(0x30);
  *puVar5 = local_a0._0_8_;
  puVar5[1] = local_a0._8_8_;
  std::function<void_()>::function
            ((function<void_()> *)(puVar5 + 2),(function<void_()> *)(local_a0 + 0x10));
  pcStack_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:210:39)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:210:39)>
             ::_M_manager;
  local_c8._M_unused._M_object = puVar5;
  ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::Callback
            ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
             ((p_Var4->_M_storage)._M_storage + 8),(function<void_()> *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  pVar8 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos(&pmVar7->_M_t,(key_type_conflict1 *)&p_Var4->_M_storage);
  if (pVar8.second == (_Base_ptr)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_drop_node(&pmVar7->_M_t,p_Var4);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node(&pmVar7->_M_t,pVar8.first,pVar8.second,p_Var4);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  std::_Function_base::~_Function_base((_Function_base *)(local_a0 + 0x10));
  (*((saveDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Group
    ).super_Container.super_ContainerBase._vptr_ContainerBase[3])
            (saveDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  pVVar6 = ::gui::Panel::getSize
                     ((this->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_a8 = (element_type *)CONCAT44(local_a8._4_4_,pVVar6->x);
  pVVar6 = ::gui::Panel::getSize
                     ((this->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  x = local_a8._0_4_ * 0.5;
  if (80.0 <= x) {
    x = 80.0;
  }
  y = pVVar6->y * 0.5;
  if (80.0 <= y) {
    y = 80.0;
  }
  ::gui::Widget::setPosition
            (&((saveDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Group).super_Container.super_Widget,x,y);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveRefuseButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void EditorInterface::showSaveDialog(const std::function<void()>& action) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto saveDialog = modalBackground_->getChild<gui::DialogBox>("saveDialog");
    auto saveDialogPtr = saveDialog.get();

    auto saveSubmitButton = saveDialog->getChild<gui::Button>("saveSubmitButton");
    saveSubmitButton->onClick.disconnectAll();
    saveSubmitButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        editor_.saveBoard();
        action();    // FIXME: the action runs immediately and doesn't give gui time to update, do we want to run this in a Timer instance instead? Could that cause issues? (someone clears the timers, or we happen to run that in a different thread)
    });

    auto saveRefuseButton = saveDialog->getChild<gui::Button>("saveRefuseButton");
    saveRefuseButton->onClick.disconnectAll();
    saveRefuseButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        action();
    });

    saveDialog->setVisible(true);
    saveDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}